

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void renameColumnParseError
               (sqlite3_context *pCtx,int bPost,sqlite3_value *pType,sqlite3_value *pObject,
               Parse *pParse)

{
  void *pvVar1;
  void *pvVar2;
  char *pcVar3;
  
  pvVar1 = sqlite3ValueText(pType,'\x01');
  pvVar2 = sqlite3ValueText(pObject,'\x01');
  pcVar3 = " after rename";
  if (bPost == 0) {
    pcVar3 = "";
  }
  pcVar3 = sqlite3_mprintf("error in %s %s%s: %s",pvVar1,pvVar2,pcVar3,pParse->zErrMsg);
  pCtx->isError = 1;
  sqlite3VdbeMemSetStr(pCtx->pOut,pcVar3,-1,'\x01',(_func_void_void_ptr *)0xffffffffffffffff);
  sqlite3_free(pcVar3);
  return;
}

Assistant:

static void renameColumnParseError(
  sqlite3_context *pCtx, 
  int bPost,
  sqlite3_value *pType,
  sqlite3_value *pObject,
  Parse *pParse
){
  const char *zT = (const char*)sqlite3_value_text(pType);
  const char *zN = (const char*)sqlite3_value_text(pObject);
  char *zErr;

  zErr = sqlite3_mprintf("error in %s %s%s: %s", 
      zT, zN, (bPost ? " after rename" : ""),
      pParse->zErrMsg
  );
  sqlite3_result_error(pCtx, zErr, -1);
  sqlite3_free(zErr);
}